

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_persistence_matrix_column_boundary.cpp
# Opt level: O3

void Boundary_column_row_access_constructors_invoker::
     run<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,(Gudhi::persistence_matrix::Column_types)0,true,false,true>>>>
               (type<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>
                *param_1)

{
  undefined8 uVar1;
  Boundary_column_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>
  t;
  Boundary_column_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>
  local_289;
  string local_288;
  undefined7 uStack_287;
  long local_278 [2];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ostringstream local_218 [112];
  ios_base local_1a8 [264];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_column_boundary.cpp"
  ;
  local_220 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Boundary_column_row_access_constructors",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0xaa);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_column_boundary.cpp"
  ;
  local_230 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Boundary_column_row_access_constructors",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0xaa);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_column_boundary.cpp"
  ;
  local_240 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Boundary_column_row_access_constructors",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0xaa);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  Boundary_column_row_access_constructors<Gudhi::persistence_matrix::List_column<Column_mini_matrix<Boundary_col_options<false,_(Gudhi::persistence_matrix::Column_types)0,_true,_false,_true>_>_>_>
  ::test_method(&local_289);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_column_boundary.cpp"
  ;
  local_250 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Boundary_column_row_access_constructors",0x27);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0xaa);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/test_persistence_matrix_column_boundary.cpp"
  ;
  local_260 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"Boundary_column_row_access_constructors",0x27);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0xaa);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(Boundary_column_row_access_constructors, Column, z5_only_row_access_columns) {
  typename Column::Master::Row_container rows;  // do not destroy before matrix
  typename Column::Column_settings settings(5);
  std::vector<Column> matrix = build_column_matrix<Column>(rows, settings);

  column_test_row_access_constructors(matrix, rows);
}